

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot_i.hpp
# Opt level: O3

void __thiscall Gnuplot::~Gnuplot(Gnuplot *this)

{
  pointer pcVar1;
  int iVar2;
  runtime_error *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  iVar2 = pclose((FILE *)this->gnucmd);
  if (iVar2 == -1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_30[0] = local_20;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_30,"Problem closing communication to gnuplot","");
    std::runtime_error::runtime_error(this_00,(string *)local_30);
    *(undefined ***)this_00 = &PTR__runtime_error_00107d78;
    __cxa_throw(this_00,&GnuplotException::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->tmpfile_list);
  pcVar1 = (this->smooth)._M_dataplus._M_p;
  paVar3 = &(this->smooth).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->pstyle)._M_dataplus._M_p;
  paVar3 = &(this->pstyle).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Gnuplot::~Gnuplot() {
//  remove_tmpfiles();
// A stream opened by popen() should be closed by pclose()
// #if defined(WIN32) || defined(_WIN32) || defined(__WIN32__) || defined(__TOS_WIN__)
//  if (_pclose(gnucmd) == -1)
 #if defined(unix) || defined(__unix) || defined(__unix__) || defined(__APPLE__)
    if (pclose(gnucmd) == -1)
 #endif
    throw GnuplotException("Problem closing communication to gnuplot");
}